

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O0

bool __thiscall
capnp::compiler::BrandedDecl::compileAsType
          (BrandedDecl *this,ErrorReporter *errorReporter,Builder target)

{
  Builder target_00;
  undefined8 uVar1;
  bool bVar2;
  NullableValue<capnp::compiler::Declaration::Which> *other;
  Which *pWVar3;
  uint64_t uVar4;
  char (*in_R8) [17];
  ResolvedParameter RVar5;
  Builder local_460;
  undefined1 local_438 [8];
  Builder builder_1;
  undefined1 local_3e8 [8];
  Builder builder;
  ResolvedParameter var;
  String local_398;
  ArrayPtr<const_char> local_380;
  Builder local_368;
  Builder local_340;
  Builder local_310;
  Builder local_2e8;
  Builder local_2b8;
  Builder local_290;
  Builder local_260;
  Builder local_238;
  ArrayPtr<const_char> local_210 [2];
  ArrayPtr<const_char> local_1f0;
  ArrayPtr<const_char> local_1d8;
  Builder local_1c8;
  undefined1 local_1a0 [8];
  Builder unconstrained;
  BrandedDecl *param;
  undefined1 local_130 [8];
  BrandedDecl *_param124;
  undefined1 auStack_100 [8];
  Builder elementType;
  undefined1 local_d0 [8];
  Builder interface;
  undefined1 local_a0 [8];
  Builder struct_;
  Type local_70;
  undefined1 local_68 [8];
  Builder enum_;
  Which *kind;
  undefined1 local_28 [4];
  NullableValue<capnp::compiler::Declaration::Which> local_24;
  undefined1 auStack_20 [4];
  NullableValue<capnp::compiler::Declaration::Which> _kind101;
  ErrorReporter *errorReporter_local;
  BrandedDecl *this_local;
  
  _auStack_20 = errorReporter;
  getKind((BrandedDecl *)local_28);
  other = kj::_::readMaybe<capnp::compiler::Declaration::Which>
                    ((Maybe<capnp::compiler::Declaration::Which> *)local_28);
  kj::_::NullableValue<capnp::compiler::Declaration::Which>::NullableValue
            ((NullableValue<capnp::compiler::Declaration::Which> *)(local_28 + 4),other);
  kj::Maybe<capnp::compiler::Declaration::Which>::~Maybe
            ((Maybe<capnp::compiler::Declaration::Which> *)local_28);
  pWVar3 = kj::_::NullableValue::operator_cast_to_Which_((NullableValue *)(local_28 + 4));
  if (pWVar3 == (Which *)0x0) {
    RVar5 = asVariable(this);
    builder._builder._32_8_ = RVar5.id;
    var.id._0_4_ = RVar5.index;
    if (builder._builder._32_8_ == 0) {
      capnp::schema::Type::Builder::initAnyPointer((Builder *)&builder_1._builder.dataSize,&target);
      capnp::schema::Type::AnyPointer::Builder::initImplicitMethodParameter
                ((Builder *)local_3e8,(Builder *)&builder_1._builder.dataSize);
      capnp::schema::Type::AnyPointer::ImplicitMethodParameter::Builder::setParameterIndex
                ((Builder *)local_3e8,(uint16_t)var.id);
      this_local._7_1_ = true;
    }
    else {
      capnp::schema::Type::Builder::initAnyPointer(&local_460,&target);
      capnp::schema::Type::AnyPointer::Builder::initParameter((Builder *)local_438,&local_460);
      capnp::schema::Type::AnyPointer::Parameter::Builder::setScopeId
                ((Builder *)local_438,builder._builder._32_8_);
      capnp::schema::Type::AnyPointer::Parameter::Builder::setParameterIndex
                ((Builder *)local_438,(uint16_t)var.id);
      this_local._7_1_ = true;
    }
  }
  else {
    enum_._builder._32_8_ =
         kj::_::NullableValue<capnp::compiler::Declaration::Which>::operator*
                   ((NullableValue<capnp::compiler::Declaration::Which> *)(local_28 + 4));
    uVar1 = _auStack_20;
    switch(*(Which *)enum_._builder._32_8_) {
    case FILE:
    case USING:
    case CONST:
    case ENUMERANT:
    case FIELD:
    case UNION:
    case GROUP:
    case METHOD:
    case ANNOTATION:
    case NAKED_ID:
    case NAKED_ANNOTATION:
      toString((String *)&var.index,this);
      kj::str<char_const(&)[2],kj::String,char_const(&)[17]>
                (&local_398,(kj *)0xa61187,(char (*) [2])&var.index,(String *)"\' is not a type.",
                 in_R8);
      kj::StringPtr::StringPtr((StringPtr *)&local_380,&local_398);
      addError(this,(ErrorReporter *)uVar1,(StringPtr)local_380);
      kj::String::~String(&local_398);
      kj::String::~String((String *)&var.index);
      this_local._7_1_ = false;
      break;
    case ENUM:
      capnp::schema::Type::Builder::initEnum((Builder *)local_68,&target);
      local_70.enum_ = (Builder *)local_68;
      uVar4 = getIdAndFillBrand<capnp::compiler::BrandedDecl::compileAsType(capnp::compiler::ErrorReporter&,capnp::schema::Type::Builder)::__0>
                        (this,&local_70);
      capnp::schema::Type::Enum::Builder::setTypeId((Builder *)local_68,uVar4);
      this_local._7_1_ = true;
      break;
    case STRUCT:
      capnp::schema::Type::Builder::initStruct((Builder *)local_a0,&target);
      interface._builder._32_8_ = local_a0;
      uVar4 = getIdAndFillBrand<capnp::compiler::BrandedDecl::compileAsType(capnp::compiler::ErrorReporter&,capnp::schema::Type::Builder)::__1>
                        (this,(Type *)&interface._builder.dataSize);
      capnp::schema::Type::Struct::Builder::setTypeId((Builder *)local_a0,uVar4);
      this_local._7_1_ = true;
      break;
    case INTERFACE:
      capnp::schema::Type::Builder::initInterface((Builder *)local_d0,&target);
      elementType._builder._32_8_ = local_d0;
      uVar4 = getIdAndFillBrand<capnp::compiler::BrandedDecl::compileAsType(capnp::compiler::ErrorReporter&,capnp::schema::Type::Builder)::__2>
                        (this,(Type *)&elementType._builder.dataSize);
      capnp::schema::Type::Interface::Builder::setTypeId((Builder *)local_d0,uVar4);
      this_local._7_1_ = true;
      break;
    case BUILTIN_VOID:
      capnp::schema::Type::Builder::setVoid(&target);
      this_local._7_1_ = true;
      break;
    case BUILTIN_BOOL:
      capnp::schema::Type::Builder::setBool(&target);
      this_local._7_1_ = true;
      break;
    case BUILTIN_INT8:
      capnp::schema::Type::Builder::setInt8(&target);
      this_local._7_1_ = true;
      break;
    case BUILTIN_INT16:
      capnp::schema::Type::Builder::setInt16(&target);
      this_local._7_1_ = true;
      break;
    case BUILTIN_INT32:
      capnp::schema::Type::Builder::setInt32(&target);
      this_local._7_1_ = true;
      break;
    case BUILTIN_INT64:
      capnp::schema::Type::Builder::setInt64(&target);
      this_local._7_1_ = true;
      break;
    case BUILTIN_U_INT8:
      capnp::schema::Type::Builder::setUint8(&target);
      this_local._7_1_ = true;
      break;
    case BUILTIN_U_INT16:
      capnp::schema::Type::Builder::setUint16(&target);
      this_local._7_1_ = true;
      break;
    case BUILTIN_U_INT32:
      capnp::schema::Type::Builder::setUint32(&target);
      this_local._7_1_ = true;
      break;
    case BUILTIN_U_INT64:
      capnp::schema::Type::Builder::setUint64(&target);
      this_local._7_1_ = true;
      break;
    case BUILTIN_FLOAT32:
      capnp::schema::Type::Builder::setFloat32(&target);
      this_local._7_1_ = true;
      break;
    case BUILTIN_FLOAT64:
      capnp::schema::Type::Builder::setFloat64(&target);
      this_local._7_1_ = true;
      break;
    case BUILTIN_TEXT:
      capnp::schema::Type::Builder::setText(&target);
      this_local._7_1_ = true;
      break;
    case BUILTIN_DATA:
      capnp::schema::Type::Builder::setData(&target);
      this_local._7_1_ = true;
      break;
    case BUILTIN_LIST:
      capnp::schema::Type::Builder::initList((Builder *)&_param124,&target);
      capnp::schema::Type::List::Builder::initElementType
                ((Builder *)auStack_100,(Builder *)&_param124);
      getListParam((BrandedDecl *)&param);
      local_130 = (undefined1  [8])
                  kj::_::readMaybe<capnp::compiler::BrandedDecl>
                            ((Maybe<capnp::compiler::BrandedDecl_&> *)&param);
      uVar1 = _auStack_20;
      if (local_130 == (undefined1  [8])0x0) {
        kj::StringPtr::StringPtr
                  ((StringPtr *)&unconstrained._builder.dataSize,
                   "\'List\' requires exactly one parameter.");
        addError(this,(ErrorReporter *)uVar1,(StringPtr)stack0xfffffffffffffe88);
        this_local._7_1_ = false;
      }
      else {
        target_00._builder.capTable = (CapTableBuilder *)elementType._builder.segment;
        target_00._builder.segment = (SegmentBuilder *)auStack_100;
        target_00._builder.data = elementType._builder.capTable;
        target_00._builder.pointers = (WirePointer *)elementType._builder.data;
        target_00._builder._32_8_ = elementType._builder.pointers;
        bVar2 = compileAsType((BrandedDecl *)local_130,(ErrorReporter *)_auStack_20,target_00);
        if (bVar2) {
          bVar2 = capnp::schema::Type::Builder::isAnyPointer((Builder *)auStack_100);
          if (bVar2) {
            capnp::schema::Type::Builder::getAnyPointer(&local_1c8,(Builder *)auStack_100);
            capnp::schema::Type::AnyPointer::Builder::getUnconstrained
                      ((Builder *)local_1a0,&local_1c8);
            bVar2 = capnp::schema::Type::AnyPointer::Unconstrained::Builder::isAnyKind
                              ((Builder *)local_1a0);
            uVar1 = _auStack_20;
            if (bVar2) {
              kj::StringPtr::StringPtr
                        ((StringPtr *)&local_1d8,"\'List(AnyPointer)\' is not supported.");
              addError(this,(ErrorReporter *)uVar1,(StringPtr)local_1d8);
              capnp::schema::Type::Builder::setVoid((Builder *)auStack_100);
              this_local._7_1_ = false;
              break;
            }
            bVar2 = capnp::schema::Type::AnyPointer::Unconstrained::Builder::isStruct
                              ((Builder *)local_1a0);
            uVar1 = _auStack_20;
            if (bVar2) {
              kj::StringPtr::StringPtr
                        ((StringPtr *)&local_1f0,"\'List(AnyStruct)\' is not supported.");
              addError(this,(ErrorReporter *)uVar1,(StringPtr)local_1f0);
              capnp::schema::Type::Builder::setVoid((Builder *)auStack_100);
              this_local._7_1_ = false;
              break;
            }
          }
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      break;
    case BUILTIN_OBJECT:
      kj::StringPtr::StringPtr
                ((StringPtr *)local_210,
                 "As of Cap\'n Proto 0.4, \'Object\' has been renamed to \'AnyPointer\'.  Sorry for the inconvenience, and thanks for being an early adopter.  :)"
                );
      addError(this,(ErrorReporter *)uVar1,(StringPtr)local_210[0]);
    case BUILTIN_ANY_POINTER:
      capnp::schema::Type::Builder::initAnyPointer(&local_260,&target);
      capnp::schema::Type::AnyPointer::Builder::initUnconstrained(&local_238,&local_260);
      capnp::schema::Type::AnyPointer::Unconstrained::Builder::setAnyKind(&local_238);
      this_local._7_1_ = true;
      break;
    case BUILTIN_ANY_STRUCT:
      capnp::schema::Type::Builder::initAnyPointer(&local_2b8,&target);
      capnp::schema::Type::AnyPointer::Builder::initUnconstrained(&local_290,&local_2b8);
      capnp::schema::Type::AnyPointer::Unconstrained::Builder::setStruct(&local_290);
      this_local._7_1_ = true;
      break;
    case BUILTIN_ANY_LIST:
      capnp::schema::Type::Builder::initAnyPointer(&local_310,&target);
      capnp::schema::Type::AnyPointer::Builder::initUnconstrained(&local_2e8,&local_310);
      capnp::schema::Type::AnyPointer::Unconstrained::Builder::setList(&local_2e8);
      this_local._7_1_ = true;
      break;
    case BUILTIN_CAPABILITY:
      capnp::schema::Type::Builder::initAnyPointer(&local_368,&target);
      capnp::schema::Type::AnyPointer::Builder::initUnconstrained(&local_340,&local_368);
      capnp::schema::Type::AnyPointer::Unconstrained::Builder::setCapability(&local_340);
      this_local._7_1_ = true;
      break;
    default:
      kj::_::unreachable();
    }
  }
  struct_._builder.pointerCount = 1;
  struct_._builder._38_2_ = 0;
  kj::_::NullableValue<capnp::compiler::Declaration::Which>::~NullableValue
            ((NullableValue<capnp::compiler::Declaration::Which> *)(local_28 + 4));
  return this_local._7_1_;
}

Assistant:

bool BrandedDecl::compileAsType(
    ErrorReporter& errorReporter, schema::Type::Builder target) {
  KJ_IF_SOME(kind, getKind()) {
    switch (kind) {
      case Declaration::ENUM: {
        auto enum_ = target.initEnum();
        enum_.setTypeId(getIdAndFillBrand([&]() { return enum_.initBrand(); }));
        return true;
      }

      case Declaration::STRUCT: {
        auto struct_ = target.initStruct();
        struct_.setTypeId(getIdAndFillBrand([&]() { return struct_.initBrand(); }));
        return true;
      }

      case Declaration::INTERFACE: {
        auto interface = target.initInterface();
        interface.setTypeId(getIdAndFillBrand([&]() { return interface.initBrand(); }));
        return true;
      }

      case Declaration::BUILTIN_LIST: {
        auto elementType = target.initList().initElementType();

        KJ_IF_SOME(param, getListParam()) {
          if (!param.compileAsType(errorReporter, elementType)) {
            return false;
          }
        } else {
          addError(errorReporter, "'List' requires exactly one parameter.");
          return false;
        }

        if (elementType.isAnyPointer()) {
          auto unconstrained = elementType.getAnyPointer().getUnconstrained();

          if (unconstrained.isAnyKind()) {
            addError(errorReporter, "'List(AnyPointer)' is not supported.");
            // Seeing List(AnyPointer) later can mess things up, so change the type to Void.
            elementType.setVoid();
            return false;
          } else if (unconstrained.isStruct()) {
            addError(errorReporter, "'List(AnyStruct)' is not supported.");
            // Seeing List(AnyStruct) later can mess things up, so change the type to Void.
            elementType.setVoid();
            return false;
          }
        }

        return true;
      }

      case Declaration::BUILTIN_VOID: target.setVoid(); return true;
      case Declaration::BUILTIN_BOOL: target.setBool(); return true;
      case Declaration::BUILTIN_INT8: target.setInt8(); return true;
      case Declaration::BUILTIN_INT16: target.setInt16(); return true;
      case Declaration::BUILTIN_INT32: target.setInt32(); return true;
      case Declaration::BUILTIN_INT64: target.setInt64(); return true;
      case Declaration::BUILTIN_U_INT8: target.setUint8(); return true;
      case Declaration::BUILTIN_U_INT16: target.setUint16(); return true;
      case Declaration::BUILTIN_U_INT32: target.setUint32(); return true;
      case Declaration::BUILTIN_U_INT64: target.setUint64(); return true;
      case Declaration::BUILTIN_FLOAT32: target.setFloat32(); return true;
      case Declaration::BUILTIN_FLOAT64: target.setFloat64(); return true;
      case Declaration::BUILTIN_TEXT: target.setText(); return true;
      case Declaration::BUILTIN_DATA: target.setData(); return true;

      case Declaration::BUILTIN_OBJECT:
        addError(errorReporter,
            "As of Cap'n Proto 0.4, 'Object' has been renamed to 'AnyPointer'.  Sorry for the "
            "inconvenience, and thanks for being an early adopter.  :)");
        KJ_FALLTHROUGH;
      case Declaration::BUILTIN_ANY_POINTER:
        target.initAnyPointer().initUnconstrained().setAnyKind();
        return true;
      case Declaration::BUILTIN_ANY_STRUCT:
        target.initAnyPointer().initUnconstrained().setStruct();
        return true;
      case Declaration::BUILTIN_ANY_LIST:
        target.initAnyPointer().initUnconstrained().setList();
        return true;
      case Declaration::BUILTIN_CAPABILITY:
        target.initAnyPointer().initUnconstrained().setCapability();
        return true;

      case Declaration::FILE:
      case Declaration::USING:
      case Declaration::CONST:
      case Declaration::ENUMERANT:
      case Declaration::FIELD:
      case Declaration::UNION:
      case Declaration::GROUP:
      case Declaration::METHOD:
      case Declaration::ANNOTATION:
      case Declaration::NAKED_ID:
      case Declaration::NAKED_ANNOTATION:
        addError(errorReporter, kj::str("'", toString(), "' is not a type."));
        return false;
    }

    KJ_UNREACHABLE;
  }